

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

FILE * open_module(char *name,char *search_dir)

{
  FILE *pFVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  FILE *pFVar7;
  int *piVar8;
  char *pcVar9;
  
  __dirp = opendir(search_dir);
  pFVar1 = _stderr;
  if (__dirp == (DIR *)0x0) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    pFVar7 = (FILE *)0x0;
    fprintf(pFVar1,"Opening the directory \"%s\" failed (%s).\n",search_dir,pcVar9);
  }
  else {
    do {
      do {
        pdVar3 = readdir(__dirp);
        if (pdVar3 == (dirent *)0x0) {
          pFVar7 = (FILE *)0x0;
          goto LAB_001031ff;
        }
        pcVar9 = pdVar3->d_name;
        sVar4 = strlen(name);
        iVar2 = strncmp(pcVar9,name,sVar4);
      } while ((iVar2 != 0) || ((pcVar9[sVar4] != '@' && (pcVar9[sVar4] != '.'))));
      sVar4 = strlen(pcVar9);
      iVar2 = strcmp(pcVar9 + (sVar4 - 5),".yang");
    } while (iVar2 != 0);
    sVar5 = strlen(search_dir);
    pcVar6 = (char *)malloc(sVar4 + sVar5 + 2);
    pFVar1 = _stderr;
    if (pcVar6 == (char *)0x0) {
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      pFVar7 = (FILE *)0x0;
      fprintf(pFVar1,"Memory allocation error (%s).\n",pcVar9);
    }
    else {
      sprintf(pcVar6,"%s/%s",search_dir,pcVar9);
      pFVar7 = fopen(pcVar6,"r");
      free(pcVar6);
      pFVar1 = _stderr;
      if (pFVar7 == (FILE *)0x0) {
        piVar8 = __errno_location();
        pcVar6 = strerror(*piVar8);
        pFVar7 = (FILE *)0x0;
        fprintf(pFVar1,"Opening file \"%s\" failed (%s).\n",pcVar9,pcVar6);
      }
    }
LAB_001031ff:
    closedir(__dirp);
  }
  return (FILE *)pFVar7;
}

Assistant:

static FILE *
open_module(const char *name, const char *search_dir)
{
    DIR *dir;
    struct dirent *dirent;
    char *path;
    FILE *ret = NULL;

    dir = opendir(search_dir);
    if (!dir) {
        fprintf(stderr, "Opening the directory \"%s\" failed (%s).\n", search_dir, strerror(errno));
        return NULL;
    }

    while ((dirent = readdir(dir))) {
        if (!strncmp(dirent->d_name, name, strlen(name))
                && ((dirent->d_name[strlen(name)] == '.') || (dirent->d_name[strlen(name)] == '@'))
                && !strcmp(dirent->d_name + strlen(dirent->d_name) - 5, ".yang")) {
            path = malloc(strlen(search_dir) + 1 + strlen(dirent->d_name) + 1);
            if (!path) {
                fprintf(stderr, "Memory allocation error (%s).\n", strerror(errno));
                break;
            }
            sprintf(path, "%s/%s", search_dir, dirent->d_name);
            ret = fopen(path, "r");
            free(path);

            if (!ret) {
                fprintf(stderr, "Opening file \"%s\" failed (%s).\n", dirent->d_name, strerror(errno));
            }
            break;
        }
    }

    closedir(dir);
    return ret;
}